

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddErrorOrWarning
          (ErrorPrinter *this,string_view filename,int line,int column,string_view message,
          string_view type,ostream *out)

{
  bool bVar1;
  ostream *poVar2;
  _Alloc_hider _Var3;
  size_t sVar4;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  _Var3._M_p = (pointer)filename._M_str;
  sVar4 = filename._M_len;
  if (this->tree_ != (DiskSourceTree *)0x0) {
    bVar1 = DiskSourceTree::VirtualFileToDiskFile(this->tree_,filename,&local_50);
    if (bVar1) {
      _Var3._M_p = local_50._M_dataplus._M_p;
      sVar4 = local_50._M_string_length;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,_Var3._M_p,sVar4);
  if (line != -1) {
    if (this->format_ == ERROR_FORMAT_MSVS) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
      poVar2 = (ostream *)std::ostream::operator<<(out,line + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") : ",4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,type._M_str,type._M_len);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," in column=",0xb);
    }
    else {
      if (this->format_ != ERROR_FORMAT_GCC) goto LAB_001e43c1;
      std::__ostream_insert<char,std::char_traits<char>>(out,":",1);
      poVar2 = (ostream *)std::ostream::operator<<(out,line + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    }
    std::ostream::operator<<(poVar2,column + 1);
  }
LAB_001e43c1:
  if ((type._M_len == 7) &&
     (*(int *)(type._M_str + 3) == 0x676e696e && *(int *)type._M_str == 0x6e726177)) {
    std::__ostream_insert<char,std::char_traits<char>>(out,": warning: ",0xb);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,message._M_str,message._M_len);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,": ",2);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,message._M_str,message._M_len);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  }
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void AddErrorOrWarning(absl::string_view filename, int line, int column,
                         absl::string_view message, absl::string_view type,
                         std::ostream& out) {
    std::string dfile;
    if (
        tree_ != nullptr && tree_->VirtualFileToDiskFile(filename, &dfile)) {
      out << dfile;
    } else {
      out << filename;
    }

    // Users typically expect 1-based line/column numbers, so we add 1
    // to each here.
    if (line != -1) {
      // Allow for both GCC- and Visual-Studio-compatible output.
      switch (format_) {
        case CommandLineInterface::ERROR_FORMAT_GCC:
          out << ":" << (line + 1) << ":" << (column + 1);
          break;
        case CommandLineInterface::ERROR_FORMAT_MSVS:
          out << "(" << (line + 1) << ") : " << type
              << " in column=" << (column + 1);
          break;
      }
    }

    if (type == "warning") {
      out << ": warning: " << message << std::endl;
    } else {
      out << ": " << message << std::endl;
    }
  }